

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# edk2_vss2.cpp
# Opt level: O2

void __thiscall edk2_vss2_t::_read(edk2_vss2_t *this)

{
  vss2_store_body_t *pvVar1;
  uint8_t uVar2;
  uint16_t uVar3;
  uint32_t uVar4;
  int iVar5;
  kstream *pkVar6;
  vss2_store_body_t *this_00;
  validation_expr_error<unsigned_int> *this_01;
  uint uVar7;
  pointer __p;
  allocator local_61;
  string local_60;
  string local_40;
  
  kaitai::kstream::read_bytes_abi_cxx11_(&local_60,(this->super_kstruct).m__io,0x10);
  std::__cxx11::string::operator=((string *)&this->m_signature,(string *)&local_60);
  std::__cxx11::string::~string((string *)&local_60);
  uVar4 = kaitai::kstream::read_u4le((this->super_kstruct).m__io);
  this->m_vss2_size = uVar4;
  if (this->f_len_vss2_store_header == true) {
    uVar7 = this->m_len_vss2_store_header;
  }
  else {
    uVar7 = 0x1c;
    this->m_len_vss2_store_header = 0x1c;
    this->f_len_vss2_store_header = true;
  }
  if ((uVar4 != 0xffffffff) && (uVar7 < uVar4)) {
    uVar2 = kaitai::kstream::read_u1((this->super_kstruct).m__io);
    this->m_format = uVar2;
    uVar2 = kaitai::kstream::read_u1((this->super_kstruct).m__io);
    this->m_state = uVar2;
    uVar3 = kaitai::kstream::read_u2le((this->super_kstruct).m__io);
    this->m_reserved = uVar3;
    uVar4 = kaitai::kstream::read_u4le((this->super_kstruct).m__io);
    this->m_reserved1 = uVar4;
    pkVar6 = (this->super_kstruct).m__io;
    if (this->f_len_vss2_store_header == true) {
      iVar5 = this->m_len_vss2_store_header;
    }
    else {
      this->m_len_vss2_store_header = 0x1c;
      this->f_len_vss2_store_header = true;
      iVar5 = 0x1c;
    }
    kaitai::kstream::read_bytes_abi_cxx11_(&local_60,pkVar6,(ulong)(this->m_vss2_size - iVar5));
    std::__cxx11::string::operator=((string *)&this->m__raw_body,(string *)&local_60);
    std::__cxx11::string::~string((string *)&local_60);
    pkVar6 = (kstream *)operator_new(0x198);
    kaitai::kstream::kstream(pkVar6,&this->m__raw_body);
    local_60._M_dataplus._M_p = (pointer)0x0;
    std::__uniq_ptr_impl<kaitai::kstream,_std::default_delete<kaitai::kstream>_>::reset
              ((__uniq_ptr_impl<kaitai::kstream,_std::default_delete<kaitai::kstream>_> *)
               &this->m__io__raw_body,pkVar6);
    std::unique_ptr<kaitai::kstream,_std::default_delete<kaitai::kstream>_>::~unique_ptr
              ((unique_ptr<kaitai::kstream,_std::default_delete<kaitai::kstream>_> *)&local_60);
    this_00 = (vss2_store_body_t *)operator_new(0x28);
    vss2_store_body_t::vss2_store_body_t
              (this_00,(this->m__io__raw_body)._M_t.
                       super___uniq_ptr_impl<kaitai::kstream,_std::default_delete<kaitai::kstream>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_kaitai::kstream_*,_std::default_delete<kaitai::kstream>_>
                       .super__Head_base<0UL,_kaitai::kstream_*,_false>._M_head_impl,this,
               this->m__root);
    pvVar1 = (this->m_body)._M_t.
             super___uniq_ptr_impl<edk2_vss2_t::vss2_store_body_t,_std::default_delete<edk2_vss2_t::vss2_store_body_t>_>
             ._M_t.
             super__Tuple_impl<0UL,_edk2_vss2_t::vss2_store_body_t_*,_std::default_delete<edk2_vss2_t::vss2_store_body_t>_>
             .super__Head_base<0UL,_edk2_vss2_t::vss2_store_body_t_*,_false>._M_head_impl;
    (this->m_body)._M_t.
    super___uniq_ptr_impl<edk2_vss2_t::vss2_store_body_t,_std::default_delete<edk2_vss2_t::vss2_store_body_t>_>
    ._M_t.
    super__Tuple_impl<0UL,_edk2_vss2_t::vss2_store_body_t_*,_std::default_delete<edk2_vss2_t::vss2_store_body_t>_>
    .super__Head_base<0UL,_edk2_vss2_t::vss2_store_body_t_*,_false>._M_head_impl = this_00;
    if (pvVar1 != (vss2_store_body_t *)0x0) {
      (**(code **)((long)(pvVar1->super_kstruct)._vptr_kstruct + 8))();
    }
    return;
  }
  this_01 = (validation_expr_error<unsigned_int> *)__cxa_allocate_exception(0x40);
  local_60._M_dataplus._M_p._0_4_ = this->m_vss2_size;
  pkVar6 = (this->super_kstruct).m__io;
  std::__cxx11::string::string((string *)&local_40,"/seq/1",&local_61);
  kaitai::validation_expr_error<unsigned_int>::validation_expr_error
            (this_01,(uint *)&local_60,pkVar6,&local_40);
  __cxa_throw(this_01,&kaitai::validation_expr_error<unsigned_int>::typeinfo,
              kaitai::kstruct_error::~kstruct_error);
}

Assistant:

void edk2_vss2_t::_read() {
    m_signature = m__io->read_bytes(16);
    m_vss2_size = m__io->read_u4le();
    {
        uint32_t _ = vss2_size();
        if (!( ((_ > static_cast<uint32_t>(len_vss2_store_header())) && (_ < 4294967295UL)) )) {
            throw kaitai::validation_expr_error<uint32_t>(vss2_size(), _io(), std::string("/seq/1"));
        }
    }
    m_format = m__io->read_u1();
    m_state = m__io->read_u1();
    m_reserved = m__io->read_u2le();
    m_reserved1 = m__io->read_u4le();
    m__raw_body = m__io->read_bytes((vss2_size() - len_vss2_store_header()));
    m__io__raw_body = std::unique_ptr<kaitai::kstream>(new kaitai::kstream(m__raw_body));
    m_body = std::unique_ptr<vss2_store_body_t>(new vss2_store_body_t(m__io__raw_body.get(), this, m__root));
}